

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_export.cpp
# Opt level: O1

string * duckdb::CreateFileName
                   (string *__return_storage_ptr__,string *id_suffix,TableCatalogEntry *table,
                   string *extension)

{
  pointer pcVar1;
  int iVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  string name;
  string schema;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe68;
  string local_190;
  string local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  undefined1 *local_f0 [2];
  undefined1 local_e0 [16];
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  char *local_50 [2];
  char local_40 [16];
  
  SanitizeExportIdentifier
            (&local_170,&(table->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.name);
  iVar2 = ::std::__cxx11::string::compare
                    ((char *)&(((table->super_StandardEntry).schema)->super_InCatalogEntry).
                              super_CatalogEntry.name);
  if (iVar2 == 0) {
    local_50[0] = local_40;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"%s%s.%s","");
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,local_170._M_dataplus._M_p,
               local_170._M_dataplus._M_p + local_170._M_string_length);
    pcVar1 = (id_suffix->_M_dataplus)._M_p;
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_90,pcVar1,pcVar1 + id_suffix->_M_string_length);
    pcVar1 = (extension->_M_dataplus)._M_p;
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b0,pcVar1,pcVar1 + extension->_M_string_length);
    StringUtil::Format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
              (__return_storage_ptr__,(StringUtil *)local_50,&local_70,&local_90,&local_b0,in_R9);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    local_d0._M_dataplus._M_p = local_50[0];
    if (local_50[0] == local_40) goto LAB_006f740c;
  }
  else {
    SanitizeExportIdentifier
              (&local_d0,
               &(((table->super_StandardEntry).schema)->super_InCatalogEntry).super_CatalogEntry.
                name);
    local_f0[0] = local_e0;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"%s_%s%s.%s","");
    local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_190,local_d0._M_dataplus._M_p,
               local_d0._M_dataplus._M_p + local_d0._M_string_length);
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_110,local_170._M_dataplus._M_p,
               local_170._M_dataplus._M_p + local_170._M_string_length);
    pcVar1 = (id_suffix->_M_dataplus)._M_p;
    local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_130,pcVar1,pcVar1 + id_suffix->_M_string_length);
    pcVar1 = (extension->_M_dataplus)._M_p;
    local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_150,pcVar1,pcVar1 + extension->_M_string_length);
    StringUtil::
    Format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
              (__return_storage_ptr__,(StringUtil *)local_f0,&local_190,&local_110,&local_130,
               &local_150,in_stack_fffffffffffffe68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != &local_150.field_2) {
      operator_delete(local_150._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._M_dataplus._M_p != &local_190.field_2) {
      operator_delete(local_190._M_dataplus._M_p);
    }
    if (local_f0[0] != local_e0) {
      operator_delete(local_f0[0]);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p == &local_d0.field_2) goto LAB_006f740c;
  }
  operator_delete(local_d0._M_dataplus._M_p);
LAB_006f740c:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != &local_170.field_2) {
    operator_delete(local_170._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

string CreateFileName(const string &id_suffix, TableCatalogEntry &table, const string &extension) {
	auto name = SanitizeExportIdentifier(table.name);
	if (table.schema.name == DEFAULT_SCHEMA) {
		return StringUtil::Format("%s%s.%s", name, id_suffix, extension);
	}
	auto schema = SanitizeExportIdentifier(table.schema.name);
	return StringUtil::Format("%s_%s%s.%s", schema, name, id_suffix, extension);
}